

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountTestTest.cpp
# Opt level: O2

string * __thiscall
CountTestText::asString_abi_cxx11_(string *__return_storage_ptr__,CountTestText *this)

{
  size_t __val;
  
  __val = oout::CountTest::count
                    ((this->count).
                     super___shared_ptr<const_oout::CountTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::to_string(__return_storage_ptr__,__val);
  return __return_storage_ptr__;
}

Assistant:

string asString() const override
	{
		return to_string(count->count());
	}